

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void tge_setup(tgestate_t *state)

{
  memset((state->speccy->screen).pixels,0,0x1800);
  memset((state->speccy->screen).attributes,7,0x300);
  (*state->speccy->out)(state->speccy,0xfe,'\0');
  (*state->speccy->draw)(state->speccy,(zxbox_t *)0x0);
  set_morale_flag_screen_attributes(state,'D');
  set_menu_item_attributes(state,0,'F');
  plot_statics_and_menu_text(state);
  plot_score(state);
  return;
}

Assistant:

TGE_API void tge_setup(tgestate_t *state)
{
  assert(state != NULL);

  wipe_full_screen_and_attributes(state);
  set_morale_flag_screen_attributes(state, attribute_BRIGHT_GREEN_OVER_BLACK);
  /* Conv: The original code passes in 68, not zero, as it uses a register
   * left over from a previous call to set_morale_flag_screen_attributes(). */
  set_menu_item_attributes(state, 0, attribute_BRIGHT_YELLOW_OVER_BLACK);
  plot_statics_and_menu_text(state);

  plot_score(state);
}